

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int send_begin(SESSION_INSTANCE *session_instance)

{
  int iVar1;
  AMQP_VALUE performative;
  AMQP_VALUE begin_performative_value;
  BEGIN_HANDLE pBStack_20;
  uint16_t remote_channel;
  BEGIN_HANDLE begin;
  SESSION_INSTANCE *pSStack_10;
  int result;
  SESSION_INSTANCE *session_instance_local;
  
  pSStack_10 = session_instance;
  pBStack_20 = begin_create(session_instance->next_outgoing_id,session_instance->incoming_window,
                            session_instance->outgoing_window);
  if (pBStack_20 == (BEGIN_HANDLE)0x0) {
    begin._4_4_ = 0xe4;
  }
  else {
    iVar1 = begin_set_handle_max(pBStack_20,pSStack_10->handle_max);
    if (iVar1 == 0) {
      if ((pSStack_10->session_state == SESSION_STATE_BEGIN_RCVD) &&
         ((iVar1 = connection_endpoint_get_incoming_channel
                             (pSStack_10->endpoint,(uint16_t *)((long)&begin_performative_value + 6)
                             ), iVar1 != 0 ||
          (iVar1 = begin_set_remote_channel(pBStack_20,begin_performative_value._6_2_), iVar1 != 0))
         )) {
        begin._4_4_ = 0xf1;
      }
      else {
        performative = amqpvalue_create_begin(pBStack_20);
        if (performative == (AMQP_VALUE)0x0) {
          begin._4_4_ = 0xf8;
        }
        else {
          iVar1 = connection_encode_frame
                            (pSStack_10->endpoint,performative,(PAYLOAD *)0x0,0,
                             (ON_SEND_COMPLETE)0x0,(void *)0x0);
          if (iVar1 == 0) {
            begin._4_4_ = 0;
          }
          else {
            begin._4_4_ = 0xfe;
          }
          amqpvalue_destroy(performative);
        }
      }
    }
    else {
      begin._4_4_ = 0xeb;
    }
    begin_destroy(pBStack_20);
  }
  return begin._4_4_;
}

Assistant:

static int send_begin(SESSION_INSTANCE* session_instance)
{
    int result;
    BEGIN_HANDLE begin = begin_create(session_instance->next_outgoing_id, session_instance->incoming_window, session_instance->outgoing_window);

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint16_t remote_channel;
        if (begin_set_handle_max(begin, session_instance->handle_max) != 0)
        {
            result = MU_FAILURE;
        }
        else if ((session_instance->session_state == SESSION_STATE_BEGIN_RCVD) &&
            ((connection_endpoint_get_incoming_channel(session_instance->endpoint, &remote_channel) != 0) ||
            (begin_set_remote_channel(begin, remote_channel) != 0)))
        {
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE begin_performative_value = amqpvalue_create_begin(begin);
            if (begin_performative_value == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                if (connection_encode_frame(session_instance->endpoint, begin_performative_value, NULL, 0, NULL, NULL) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(begin_performative_value);
            }
        }

        begin_destroy(begin);
    }

    return result;
}